

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O0

bool spectest::CheckIR(string *filename,bool validate)

{
  bool bVar1;
  Result result;
  pointer log_stream;
  char *filename_00;
  uchar *data;
  size_type size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  string_view filename_01;
  undefined1 auVar2 [16];
  ValidateOptions local_473;
  Enum local_460;
  Enum local_45c;
  undefined1 local_458 [8];
  Module module;
  Errors errors;
  ReadBinaryOptions options;
  bool kFailOnCustomSectionError;
  bool kStopOnFirstError;
  bool kReadDebugNames;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  bool validate_local;
  string *filename_local;
  
  file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = validate;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)filename);
  filename_01._M_str = local_38;
  filename_01._M_len = auVar2._8_8_;
  result = wabt::ReadFile(auVar2._0_8_,filename_01,in_RCX);
  bVar1 = wabt::Failed(result);
  if (bVar1) {
    filename_local._7_1_ = false;
  }
  else {
    log_stream = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                           (&s_log_stream);
    wabt::ReadBinaryOptions::ReadBinaryOptions
              ((ReadBinaryOptions *)
               &errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&s_features,&log_stream->super_Stream,true
               ,true,true);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    wabt::Module::Module((Module *)local_458);
    filename_00 = (char *)std::__cxx11::string::c_str();
    data = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    local_45c = (Enum)wabt::ReadBinaryIr(filename_00,data,size,
                                         (ReadBinaryOptions *)
                                         &errors.
                                          super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (Errors *)
                                         &module.used_func_refs._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count,(Module *)local_458);
    bVar1 = wabt::Failed((Result)local_45c);
    if (bVar1) {
      filename_local._7_1_ = false;
    }
    else if ((file_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      filename_local._7_1_ = true;
    }
    else {
      wabt::ValidateOptions::ValidateOptions(&local_473,&s_features);
      local_460 = (Enum)wabt::ValidateModule
                                  ((Module *)local_458,
                                   (Errors *)
                                   &module.used_func_refs._M_t._M_impl.super__Rb_tree_header.
                                    _M_node_count,&local_473);
      filename_local._7_1_ = wabt::Succeeded((Result)local_460);
    }
    wabt::Module::~Module((Module *)local_458);
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
              ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)
               &module.used_func_refs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  return filename_local._7_1_;
}

Assistant:

bool CheckIR(const std::string& filename, bool validate) {
  std::vector<uint8_t> file_data;

  if (Failed(ReadFile(filename, &file_data))) {
    return false;
  }

  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = true;
  const bool kFailOnCustomSectionError = true;
  ReadBinaryOptions options(s_features, s_log_stream.get(), kReadDebugNames,
                            kStopOnFirstError, kFailOnCustomSectionError);

  Errors errors;
  wabt::Module module;
  if (Failed(ReadBinaryIr(filename.c_str(), file_data.data(), file_data.size(),
                          options, &errors, &module))) {
    return false;
  }

  if (!validate) {
    return true;
  }

  return Succeeded(
      ValidateModule(&module, &errors, ValidateOptions{s_features}));
}